

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O1

ssize_t __thiscall jaegertracing::thrift::Tag::read(Tag *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _func_int **pp_Var5;
  undefined8 *puVar6;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int16_t fid;
  int32_t ecast0;
  TType ftype;
  string fname;
  ushort local_92;
  uint local_90;
  uint local_8c;
  type local_88;
  int local_84;
  string *local_80;
  string *local_78;
  double *local_70;
  bool *local_68;
  int64_t *local_60;
  string *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar1 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  local_58 = &this->vBinary;
  local_60 = &this->vLong;
  local_68 = &this->vBool;
  local_70 = &this->vDouble;
  local_78 = &this->vStr;
  local_80 = &this->key;
  local_8c = 0;
  local_90 = 0;
  do {
    iVar2 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_84,&local_92);
    if (local_84 == 0) {
      iVar3 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if (((local_8c & 1) != 0) && ((local_90 & 1) != 0)) {
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
        return (ulong)(uint)(iVar3 + iVar2 + iVar1);
      }
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
      puVar6[1] = puVar6 + 3;
      puVar6[2] = 0;
      *(undefined1 *)(puVar6 + 3) = 0;
      *puVar6 = &PTR__TException_002766f0;
      *(undefined4 *)(puVar6 + 5) = 1;
      __cxa_throw(puVar6,&apache::thrift::protocol::TProtocolException::typeinfo,
                  apache::thrift::TException::~TException);
    }
    switch(local_92) {
    case 1:
      pp_Var5 = this_00->_vptr_TProtocol;
      if (local_84 != 0xb) goto LAB_0020f15d;
      iVar3 = (*pp_Var5[0x2a])(this_00,local_80);
      local_8c = (uint)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
      break;
    case 2:
      if (local_84 != 8) goto switchD_0020f04b_default;
      iVar3 = (*this_00->_vptr_TProtocol[0x27])(this_00,&local_88);
      this->vType = local_88;
      local_90 = (uint)CONCAT71((uint7)(uint3)(local_88 >> 8),1);
      break;
    case 3:
      pp_Var5 = this_00->_vptr_TProtocol;
      if (local_84 != 0xb) goto LAB_0020f15d;
      iVar3 = (*pp_Var5[0x2a])(this_00,local_78);
      this->__isset = (_Tag__isset)((byte)this->__isset | 1);
      break;
    case 4:
      pp_Var5 = this_00->_vptr_TProtocol;
      if (local_84 != 4) goto LAB_0020f15d;
      iVar3 = (*pp_Var5[0x29])(this_00,local_70);
      this->__isset = (_Tag__isset)((byte)this->__isset | 2);
      break;
    case 5:
      pp_Var5 = this_00->_vptr_TProtocol;
      if (local_84 != 2) goto LAB_0020f15d;
      iVar3 = (*pp_Var5[0x23])(this_00,local_68);
      this->__isset = (_Tag__isset)((byte)this->__isset | 4);
      break;
    case 6:
      pp_Var5 = this_00->_vptr_TProtocol;
      if (local_84 != 10) goto LAB_0020f15d;
      iVar3 = (*pp_Var5[0x28])(this_00,local_60);
      this->__isset = (_Tag__isset)((byte)this->__isset | 8);
      break;
    case 7:
      pp_Var5 = this_00->_vptr_TProtocol;
      if (local_84 != 0xb) goto LAB_0020f15d;
      iVar3 = (*pp_Var5[0x2b])(this_00,local_58);
      this->__isset = (_Tag__isset)((byte)this->__isset | 0x10);
      break;
    default:
switchD_0020f04b_default:
      pp_Var5 = this_00->_vptr_TProtocol;
LAB_0020f15d:
      iVar3 = (*pp_Var5[0x2c])(this_00);
    }
    iVar4 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar1 = iVar3 + iVar2 + iVar1 + iVar4;
  } while( true );
}

Assistant:

uint32_t Tag::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_key = false;
  bool isset_vType = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->key);
          isset_key = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast0;
          xfer += iprot->readI32(ecast0);
          this->vType = (TagType::type)ecast0;
          isset_vType = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->vStr);
          this->__isset.vStr = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_DOUBLE) {
          xfer += iprot->readDouble(this->vDouble);
          this->__isset.vDouble = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_BOOL) {
          xfer += iprot->readBool(this->vBool);
          this->__isset.vBool = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->vLong);
          this->__isset.vLong = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readBinary(this->vBinary);
          this->__isset.vBinary = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_key)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_vType)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}